

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<5U>::
impl<bool_(StimulationCommand::*)(int,_int,_int,_int),_boost::python::default_call_policies,_boost::mpl::vector6<bool,_StimulationCommand_&,_int,_int,_int,_int>_>
::operator()(impl<bool_(StimulationCommand::*)(int,_int,_int,_int),_boost::python::default_call_policies,_boost::mpl::vector6<bool,_StimulationCommand_&,_int,_int,_int,_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  PyObject *pPVar3;
  c_t0 c0;
  c_t4 c4;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  undefined1 local_a9;
  long local_a8;
  undefined1 local_a0 [16];
  PyTypeObject *local_88;
  undefined1 local_80 [16];
  _object *local_68;
  undefined1 local_60 [16];
  PyTypeObject *local_48;
  undefined1 local_40 [16];
  _object *local_28;
  
  local_a8 = converter::get_lvalue_from_python
                       ((_object *)args_[1].ob_type,
                        converter::detail::registered_base<StimulationCommand_const_volatile&>::
                        converters);
  if (local_a8 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_40 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::registered_base<int_const_volatile&>::converters
                         );
    if (local_40._0_8_ != 0) {
      pPVar2 = args_[2].ob_type;
      local_28 = p_Var1;
      local_60 = converter::rvalue_from_python_stage1
                           ((_object *)pPVar2,
                            converter::detail::registered_base<int_const_volatile&>::converters);
      if (local_60._0_8_ != 0) {
        p_Var1 = (_object *)args_[3].ob_refcnt;
        local_48 = pPVar2;
        local_80 = converter::rvalue_from_python_stage1
                             (p_Var1,converter::detail::registered_base<int_const_volatile&>::
                                     converters);
        if (local_80._0_8_ != 0) {
          pPVar2 = args_[3].ob_type;
          local_68 = p_Var1;
          local_a0 = converter::rvalue_from_python_stage1
                               ((_object *)pPVar2,
                                converter::detail::registered_base<int_const_volatile&>::converters)
          ;
          if (local_a0._0_8_ != 0) {
            local_88 = pPVar2;
            pPVar3 = invoke<boost::python::to_python_value<bool_const&>,bool(StimulationCommand::*)(int,int,int,int),boost::python::arg_from_python<StimulationCommand&>,boost::python::arg_from_python<int>,boost::python::arg_from_python<int>,boost::python::arg_from_python<int>,boost::python::arg_from_python<int>>
                               (&local_a9,this,&local_a8,local_40,local_60,local_80,local_a0);
            return pPVar3;
          }
        }
      }
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }